

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlFreeCatalogHashEntryList(void *payload,xmlChar *name)

{
  _xmlCatalogEntry *p_Var1;
  xmlCatalogEntryPtr next;
  xmlCatalogEntryPtr children;
  xmlCatalogEntryPtr catal;
  xmlChar *name_local;
  void *payload_local;
  
  if (payload != (void *)0x0) {
    next = *(xmlCatalogEntryPtr *)((long)payload + 0x10);
    while (next != (xmlCatalogEntryPtr)0x0) {
      p_Var1 = next->next;
      next->dealloc = 0;
      next->children = (_xmlCatalogEntry *)0x0;
      xmlFreeCatalogEntry(next,(xmlChar *)0x0);
      next = p_Var1;
    }
    *(undefined4 *)((long)payload + 0x3c) = 0;
    xmlFreeCatalogEntry(payload,(xmlChar *)0x0);
  }
  return;
}

Assistant:

static void
xmlFreeCatalogHashEntryList(void *payload,
                            const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr catal = (xmlCatalogEntryPtr) payload;
    xmlCatalogEntryPtr children, next;

    if (catal == NULL)
	return;

    children = catal->children;
    while (children != NULL) {
	next = children->next;
	children->dealloc = 0;
	children->children = NULL;
	xmlFreeCatalogEntry(children, NULL);
	children = next;
    }
    catal->dealloc = 0;
    xmlFreeCatalogEntry(catal, NULL);
}